

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_dform3D(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  DisasContext_conflict10 *ctx_local;
  
  if ((ctx->opcode & 3) == 1) {
    uVar1 = ctx->opcode & 7;
    if (uVar1 == 1) {
      if ((ctx->insns_flags2 & 0x80000) != 0) {
        gen_lxv(ctx);
        return;
      }
    }
    else if ((uVar1 == 5) && ((ctx->insns_flags2 & 0x80000) != 0)) {
      gen_stxv(ctx);
      return;
    }
  }
  else {
    uVar1 = ctx->opcode & 3;
    if (uVar1 == 0) {
      if ((ctx->insns_flags2 & 0x20) != 0) {
        gen_stfdp(ctx);
        return;
      }
    }
    else if (uVar1 == 2) {
      if ((ctx->insns_flags2 & 0x80000) != 0) {
        gen_stxsd(ctx);
        return;
      }
    }
    else if ((uVar1 == 3) && ((ctx->insns_flags2 & 0x80000) != 0)) {
      gen_stxssp(ctx);
      return;
    }
  }
  gen_invalid(ctx);
  return;
}

Assistant:

static void gen_dform3D(DisasContext *ctx)
{
    if ((ctx->opcode & 3) == 1) { /* DQ-FORM */
        switch (ctx->opcode & 0x7) {
        case 1: /* lxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_lxv(ctx);
            }
            break;
        case 5: /* stxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxv(ctx);
            }
            break;
        }
    } else { /* DS-FORM */
        switch (ctx->opcode & 0x3) {
        case 0: /* stfdp */
            if (ctx->insns_flags2 & PPC2_ISA205) {
                return gen_stfdp(ctx);
            }
            break;
        case 2: /* stxsd */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxsd(ctx);
            }
            break;
        case 3: /* stxssp */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxssp(ctx);
            }
            break;
        }
    }
    return gen_invalid(ctx);
}